

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_int_internal<int>(string *text,int *value_p)

{
  bool bVar1;
  string local_48;
  bool local_21;
  int *piStack_20;
  bool negative;
  int *value_p_local;
  string *text_local;
  
  *value_p = 0;
  piStack_20 = value_p;
  value_p_local = (int *)text;
  bVar1 = safe_parse_sign(text,&local_21);
  if (bVar1) {
    if ((local_21 & 1U) == 0) {
      std::__cxx11::string::string((string *)&local_48,(string *)text);
      text_local._7_1_ = safe_parse_positive_int<int>(&local_48,piStack_20);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      text_local._7_1_ = safe_parse_negative_int<int>(text,piStack_20);
    }
  }
  else {
    text_local._7_1_ = 0;
  }
  return (bool)(text_local._7_1_ & 1);
}

Assistant:

bool safe_int_internal(std::string text, IntType *value_p) {
  *value_p = 0;
  bool negative;
  if (!safe_parse_sign(&text, &negative)) {
    return false;
  }
  if (!negative) {
    return safe_parse_positive_int(text, value_p);
  } else {
    return safe_parse_negative_int(text, value_p);
  }
}